

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetOutputTargetType(cmTarget *this,bool implib)

{
  TargetType TVar1;
  bool implib_local;
  cmTarget *this_local;
  
  TVar1 = GetType(this);
  switch(TVar1) {
  case EXECUTABLE:
    if (implib) {
      this_local = (cmTarget *)0xa5c667;
    }
    else {
      this_local = (cmTarget *)anon_var_dwarf_3d93e4;
    }
    break;
  case STATIC_LIBRARY:
    this_local = (cmTarget *)0xa5c667;
    break;
  case SHARED_LIBRARY:
    if ((this->DLLPlatform & 1U) == 0) {
      this_local = (cmTarget *)0xa7e438;
    }
    else if (implib) {
      this_local = (cmTarget *)0xa5c667;
    }
    else {
      this_local = (cmTarget *)anon_var_dwarf_3d93e4;
    }
    break;
  case MODULE_LIBRARY:
    if (implib) {
      this_local = (cmTarget *)0xa5c667;
    }
    else {
      this_local = (cmTarget *)0xa7e438;
    }
    break;
  default:
    this_local = (cmTarget *)0xaac4df;
  }
  return (char *)this_local;
}

Assistant:

const char* cmTarget::GetOutputTargetType(bool implib) const
{
  switch(this->GetType())
    {
    case cmTarget::SHARED_LIBRARY:
      if(this->DLLPlatform)
        {
        if(implib)
          {
          // A DLL import library is treated as an archive target.
          return "ARCHIVE";
          }
        else
          {
          // A DLL shared library is treated as a runtime target.
          return "RUNTIME";
          }
        }
      else
        {
        // For non-DLL platforms shared libraries are treated as
        // library targets.
        return "LIBRARY";
        }
    case cmTarget::STATIC_LIBRARY:
      // Static libraries are always treated as archive targets.
      return "ARCHIVE";
    case cmTarget::MODULE_LIBRARY:
      if(implib)
        {
        // Module libraries are always treated as library targets.
        return "ARCHIVE";
        }
      else
        {
        // Module import libraries are treated as archive targets.
        return "LIBRARY";
        }
    case cmTarget::EXECUTABLE:
      if(implib)
        {
        // Executable import libraries are treated as archive targets.
        return "ARCHIVE";
        }
      else
        {
        // Executables are always treated as runtime targets.
        return "RUNTIME";
        }
    default:
      break;
    }
  return "";
}